

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

TidyOptionDoc * prvTidyOptGetDocDesc(TidyOptionId optId)

{
  long lVar1;
  long lVar2;
  
  if (optId == TidyAsciiChars) {
    return docs_xrefs;
  }
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x10 == 400) {
      return (TidyOptionDoc *)0x0;
    }
    lVar1 = lVar2 + 0x10;
  } while (*(TidyOptionId *)((long)&docs_xrefs[1].opt + lVar2) != optId);
  return (TidyOptionDoc *)((long)&docs_xrefs[1].opt + lVar2);
}

Assistant:

const TidyOptionDoc* TY_(OptGetDocDesc)( TidyOptionId optId )
{
    uint i = 0;

    while( docs_xrefs[i].opt != N_TIDY_OPTIONS )
    {
        if ( docs_xrefs[i].opt == optId )
            return &docs_xrefs[i];
        ++i;
    }
    return NULL;
}